

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

longlong cfgfile::format_t<long_long,_cfgfile::string_trait_t>::from_string
                   (parser_info_t<cfgfile::string_trait_t> *info,string_t *value)

{
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  parser_info_t<cfgfile::string_trait_t> *in_RDI;
  exception *anon_var_0;
  longlong result;
  size_t pos;
  string *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  string_t *in_stack_fffffffffffffb78;
  exception_t<cfgfile::string_trait_t> *in_stack_fffffffffffffb80;
  allocator<char> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_179 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_131 [8];
  longlong local_20;
  long local_18;
  parser_info_t<cfgfile::string_trait_t> *local_8;
  
  local_18 = 0;
  local_8 = in_RDI;
  local_20 = std::__cxx11::stoll(in_stack_fffffffffffffb70,(size_t *)in_stack_fffffffffffffb68,0);
  lVar1 = local_18;
  lVar2 = std::__cxx11::string::length();
  if (lVar1 != lVar2) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x30);
    this = local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__lhs,in_stack_fffffffffffffba0)
    ;
    string_trait_t::from_ascii(in_stack_fffffffffffffb68);
    std::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    __rhs = local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__lhs,(allocator<char> *)__rhs);
    string_trait_t::from_ascii(in_stack_fffffffffffffb68);
    std::operator+(__lhs,__rhs);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_8);
    std::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__lhs,(allocator<char> *)__rhs);
    string_trait_t::from_ascii(in_stack_fffffffffffffb68);
    std::operator+(__lhs,__rhs);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_8);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffb68);
    std::operator+(__lhs,__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__lhs,(allocator<char> *)__rhs);
    string_trait_t::from_ascii(in_stack_fffffffffffffb68);
    std::operator+(__lhs,__rhs);
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    __cxa_throw(__lhs,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  return local_20;
}

Assistant:

static long long from_string( const parser_info_t< string_trait_t > & info,
		const string_trait_t::string_t & value )
	{
		try {
			std::size_t pos = 0;

			long long result = std::stoll( value, &pos );

			if( pos != value.length() )
				throw exception_t< string_trait_t >(
					string_trait_t::from_ascii( "Invalid value: \"" ) +
					value + string_trait_t::from_ascii( "\". In file \"" ) +
					info.file_name() +
					string_trait_t::from_ascii( "\" on line " ) +
					string_trait_t::to_string( info.line_number() ) +
					string_trait_t::from_ascii( "." ) );

			return result;
		}
		catch( const std::exception & )
		{
			throw exception_t< string_trait_t >(
				string_trait_t::from_ascii( "Invalid value: \"" ) +
				value + string_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				string_trait_t::from_ascii( "\" on line " ) +
				string_trait_t::to_string( info.line_number() ) +
				string_trait_t::from_ascii( "." ) );
		}
	}